

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBlifMv.c
# Opt level: O2

char * Abc_NodeConvertSopToMvSop(int nVars,Vec_Int_t *vSop0,Vec_Int_t *vSop1)

{
  uint uVar1;
  char *pcVar2;
  byte bVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  char cVar8;
  char *__size;
  char *pcVar9;
  bool bVar10;
  
  iVar5 = vSop0->nSize;
  if ((iVar5 == 0) || (vSop1->nSize == 0)) {
    pcVar2 = (char *)malloc((long)(nVars + 3));
    uVar6 = 0;
    uVar4 = 0;
    if (0 < nVars) {
      uVar4 = (ulong)(uint)nVars;
    }
    for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
      pcVar2[uVar6] = '-';
    }
    pcVar2[nVars] = 0 < vSop1->nSize | 0x30;
    (pcVar2 + (long)nVars + 1)[0] = '\n';
    (pcVar2 + (long)nVars + 1)[1] = '\0';
  }
  else {
    __size = (char *)(long)((nVars + 2) * (vSop1->nSize + iVar5) + 1);
    pcVar2 = (char *)malloc((size_t)__size);
    iVar7 = 0;
    pcVar9 = pcVar2;
    if (nVars < 1) {
      nVars = iVar7;
    }
    for (; iVar7 < iVar5; iVar7 = iVar7 + 1) {
      uVar1 = Vec_IntEntry(vSop0,iVar7);
      pcVar9 = pcVar9 + 2;
      bVar3 = 0;
      iVar5 = nVars;
      while (bVar10 = iVar5 != 0, iVar5 = iVar5 + -1, bVar10) {
        switch(uVar1 >> (bVar3 & 0x1f) & 3) {
        case 0:
          cVar8 = '-';
          break;
        case 1:
          cVar8 = '0';
          break;
        case 2:
          cVar8 = '1';
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                        ,0x42f,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)");
        }
        pcVar9[-2] = cVar8;
        pcVar9 = pcVar9 + 1;
        bVar3 = bVar3 + 2;
      }
      pcVar9[-2] = '0';
      pcVar9[-1] = '\n';
      iVar5 = vSop0->nSize;
    }
    for (iVar5 = 0; iVar5 < vSop1->nSize; iVar5 = iVar5 + 1) {
      uVar1 = Vec_IntEntry(vSop1,iVar5);
      pcVar9 = pcVar9 + 2;
      bVar3 = 0;
      iVar7 = nVars;
      while (bVar10 = iVar7 != 0, iVar7 = iVar7 + -1, bVar10) {
        switch(uVar1 >> (bVar3 & 0x1f) & 3) {
        case 0:
          cVar8 = '-';
          break;
        case 1:
          cVar8 = '0';
          break;
        case 2:
          cVar8 = '1';
          break;
        case 3:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                        ,0x441,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)");
        }
        pcVar9[-2] = cVar8;
        pcVar9 = pcVar9 + 1;
        bVar3 = bVar3 + 2;
      }
      pcVar9[-2] = '1';
      pcVar9[-1] = '\n';
    }
    *pcVar9 = '\0';
    if (pcVar9 + (1 - (long)pcVar2) != __size) {
      __assert_fail("pCur - pMvSop == nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcBlifMv.c"
                    ,0x447,"char *Abc_NodeConvertSopToMvSop(int, Vec_Int_t *, Vec_Int_t *)");
    }
  }
  return pcVar2;
}

Assistant:

char * Abc_NodeConvertSopToMvSop( int nVars, Vec_Int_t * vSop0, Vec_Int_t * vSop1 )
{
    char * pMvSop, * pCur;
    unsigned uCube;
    int nCubes, nSize, Value, i, k;
    // consider the case of the constant node
    if ( Vec_IntSize(vSop0) == 0 || Vec_IntSize(vSop1) == 0 )
    {
        // (temporary) create a tautology cube
        pMvSop = ABC_ALLOC( char, nVars + 3 );
        for ( k = 0; k < nVars; k++ )
            pMvSop[k] = '-';
        pMvSop[nVars] = '0' + (int)(Vec_IntSize(vSop1) > 0);
        pMvSop[nVars+1] = '\n';
        pMvSop[nVars+2] = 0;
        return pMvSop;
    }
    // find the total number of cubes
    nCubes = Vec_IntSize(vSop0) + Vec_IntSize(vSop1);
    // find the size of the MVSOP represented as a C-string
    // (each cube has nVars variables + one output literal + end-of-line,
    // and the string is zero-terminated)
    nSize = nCubes * (nVars + 2) + 1; 
    // allocate memory
    pMvSop = pCur = ABC_ALLOC( char, nSize );
    // fill in the negative polarity cubes
    Vec_IntForEachEntry( vSop0, uCube, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Value = (uCube >> (2*k)) & 3;
            if ( Value == 1 )
                *pCur++ = '0';
            else if ( Value == 2 )
                *pCur++ = '1';
            else if ( Value == 0 )
                *pCur++ = '-';
            else
                assert( 0 );
        }
        *pCur++ = '0';
        *pCur++ = '\n';
    }
    // fill in the positive polarity cubes
    Vec_IntForEachEntry( vSop1, uCube, i )
    {
        for ( k = 0; k < nVars; k++ )
        {
            Value = (uCube >> (2*k)) & 3;
            if ( Value == 1 )
                *pCur++ = '0';
            else if ( Value == 2 )
                *pCur++ = '1';
            else if ( Value == 0 )
                *pCur++ = '-';
            else
                assert( 0 );
        }
        *pCur++ = '1';
        *pCur++ = '\n';
    }
    *pCur++ = 0;
    assert( pCur - pMvSop == nSize );
    return pMvSop;
}